

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_node.cpp
# Opt level: O2

string * __thiscall
duckdb::CTENode::ToString_abi_cxx11_(string *__return_storage_ptr__,CTENode *this)

{
  pointer pQVar1;
  string local_30 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pQVar1 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     (&this->child);
  (*pQVar1->_vptr_QueryNode[3])(local_30,pQVar1);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

string CTENode::ToString() const {
	string result;
	result += child->ToString();
	return result;
}